

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

double wdm::utils::perm_sum(vector<double,_std::allocator<double>_> *x,size_t k)

{
  pointer pdVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  vector<double,_std::allocator<double>_> res;
  allocator_type local_71;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (k == 0) {
    return 1.0;
  }
  local_70 = 0.0;
  uVar3 = 1;
  do {
    lVar2 = uVar3 - 1;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    local_58 = pow(-1.0,(auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    local_60 = perm_sum(x,k - uVar3);
    local_50 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_48,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_50,&local_71);
    if (uVar3 != 0) {
      pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
      if (lVar2 != 0) {
        lVar2 = lVar2 >> 3;
        lVar4 = 0;
        uVar5 = uVar3;
        do {
          do {
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] =
                 pdVar1[lVar4] *
                 local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          lVar4 = lVar4 + 1;
          uVar5 = uVar3;
        } while (lVar4 != lVar2 + (ulong)(lVar2 == 0));
      }
    }
    if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      dVar7 = 0.0;
    }
    else {
      lVar2 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      dVar7 = 0.0;
      lVar4 = 0;
      do {
        dVar7 = dVar7 + local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
    }
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      local_68 = dVar7;
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      dVar7 = local_68;
    }
    local_70 = local_70 + local_58 * local_60 * dVar7;
    uVar3 = uVar3 + 1;
  } while (uVar3 <= k);
  auVar8._8_4_ = (int)(k >> 0x20);
  auVar8._0_8_ = k;
  auVar8._12_4_ = 0x45300000;
  return local_70 /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
}

Assistant:

inline double perm_sum(const std::vector<double>& x, size_t k)
{
    if (k == 0)
        return 1.0;
    double s = 0;
    for (size_t i = 1; i <= k; i++)
        s += std::pow(-1.0, i - 1) * perm_sum(x, k - i) * sum(pow(x, i));
    return s / k;
}